

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O0

int fminsearch(custom_function *funcpt,int N,double *xi,double *xf)

{
  double *dx_00;
  double eps_00;
  double *dx;
  double eps;
  double fsval;
  int niter;
  int MAXITER;
  int retval;
  int i;
  double *xf_local;
  double *xi_local;
  custom_function *pcStack_10;
  int N_local;
  custom_function *funcpt_local;
  
  _retval = xf;
  xf_local = xi;
  xi_local._4_4_ = N;
  pcStack_10 = funcpt;
  dx_00 = (double *)malloc((long)N << 3);
  fsval._4_4_ = xi_local._4_4_ * 200;
  fsval._0_4_ = 0;
  eps_00 = macheps();
  for (MAXITER = 0; MAXITER < xi_local._4_4_; MAXITER = MAXITER + 1) {
    dx_00[MAXITER] = 1.0;
  }
  niter = nel_min(pcStack_10,xf_local,xi_local._4_4_,dx_00,1.0,fsval._4_4_,(int *)&fsval,eps_00,
                  _retval);
  free(dx_00);
  return niter;
}

Assistant:

int fminsearch(custom_function *funcpt,int N,double *xi,double *xf) {
	int i,retval,MAXITER,niter;
	double fsval,eps;
	double *dx;

	dx = (double*) malloc(sizeof(double) * N);

	fsval = 1.0;
	MAXITER = 200*N;
	niter = 0;
	eps = macheps(); // Use macheps program

	for(i = 0; i < N;++i) {
		dx[i] = 1.0;
	}

	retval = nel_min(funcpt,xi,N,dx,fsval,MAXITER,&niter,eps,xf);

	//printf("Iterations %d \n", niter);

	free(dx);
	return retval;
}